

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_greedy<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  float fVar1;
  example *peVar2;
  action_score *paVar3;
  action_score *paVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  peVar2 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar3 = (peVar2->pred).a_s._begin;
  paVar4 = (action_score *)(peVar2->pred).scalars._end;
  uVar5 = (long)paVar4 - (long)paVar3 >> 3;
  uVar7 = 0;
  if ((paVar4 != paVar3) && (uVar6 = 1, uVar7 = uVar6, 1 < uVar5)) {
    do {
      uVar7 = uVar6;
      if ((paVar3[uVar6].score != paVar3->score) || (NAN(paVar3[uVar6].score) || NAN(paVar3->score))
         ) break;
      uVar6 = uVar6 + 1;
      uVar7 = uVar5;
    } while (uVar5 != uVar6);
  }
  if ((uVar5 & 0xffffffff) != 0) {
    fVar1 = data->epsilon;
    uVar6 = 0;
    do {
      (peVar2->pred).a_s._begin[uVar6].score = fVar1 / (float)(uVar5 & 0xffffffff);
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0xffffffff) != uVar6);
  }
  if (data->first_only == false) {
    if (uVar7 != 0) {
      uVar5 = 0;
      do {
        paVar3 = (peVar2->pred).a_s._begin;
        paVar3[uVar5].score = (1.0 - data->epsilon) / (float)uVar7 + paVar3[uVar5].score;
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
  }
  else {
    paVar3 = (peVar2->pred).a_s._begin;
    paVar3->score = (1.0 - data->epsilon) + paVar3->score;
  }
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Explore uniform random an epsilon fraction of the time.
  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  action_scores& preds = examples[0]->pred.a_s;

  uint32_t num_actions = (uint32_t)preds.size();

  size_t tied_actions = fill_tied(data, preds);

  const float prob = data.epsilon / num_actions;
  for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
  if (!data.first_only)
  {
    for (size_t i = 0; i < tied_actions; ++i) preds[i].score += (1.f - data.epsilon) / tied_actions;
  }
  else
    preds[0].score += 1.f - data.epsilon;
}